

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extensions.cpp
# Opt level: O0

void __thiscall
uWS::ExtensionsNegotiator<false>::readOffer(ExtensionsNegotiator<false> *this,string *offer)

{
  string *offer_local;
  ExtensionsNegotiator<false> *this_local;
  
  return;
}

Assistant:

void ExtensionsNegotiator<isServer>::readOffer(std::string offer) {
    if (isServer) {
        ExtensionsParser extensionsParser(offer.data(), offer.length());
        if ((options & PERMESSAGE_DEFLATE) && extensionsParser.perMessageDeflate) {
            if (extensionsParser.clientNoContextTakeover || (options & CLIENT_NO_CONTEXT_TAKEOVER)) {
                options |= CLIENT_NO_CONTEXT_TAKEOVER;
            }

            if (extensionsParser.serverNoContextTakeover) {
                options |= SERVER_NO_CONTEXT_TAKEOVER;
            } else {
                options &= ~SERVER_NO_CONTEXT_TAKEOVER;
            }
        } else {
            options &= ~PERMESSAGE_DEFLATE;
        }
    } else {
        // todo!
    }
}